

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Vector<float,_3>_> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Cross::doExpand
          (Cross *this,ExpandContext *param_1,ArgExprs *x)

{
  int in_ECX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Vector<float,_3>_> EVar1;
  ExprP<float> local_188;
  ExprP<float> local_178;
  ExprP<float> local_168;
  ExprP<float> local_158;
  ExprP<float> local_148;
  ExprP<float> local_138;
  ExprP<float> local_128;
  ExprP<float> local_118;
  ExprP<float> local_108;
  ExprP<float> local_f8;
  ExprP<float> local_e8;
  ExprP<float> local_d8;
  ExprP<float> local_c8;
  ExprP<float> local_b8;
  ExprP<float> local_a8;
  ExprP<float> local_98;
  ExprP<float> local_88 [2];
  ExprP<float> local_68;
  ExprP<float> local_58;
  ExprP<float> local_48;
  ExprP<float> local_38;
  int local_28;
  ArgExprs *x_local;
  ExpandContext *param_1_local;
  Cross *this_local;
  
  x_local = x;
  param_1_local = param_1;
  this_local = this;
  local_28 = in_ECX;
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_58,in_ECX);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_68,local_28 + 0x10);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_48,&local_58,&local_68);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_98,local_28 + 0x10);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_a8,local_28);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)local_88,&local_98,&local_a8);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_38,&local_48,local_88);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_d8,local_28);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_e8,local_28 + 0x10);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_c8,&local_d8,&local_e8);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_108,local_28 + 0x10);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_118,local_28);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_f8,&local_108,&local_118);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_b8,&local_c8,&local_f8);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_148,local_28);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_158,local_28 + 0x10);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_138,&local_148,&local_158);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_178,local_28 + 0x10);
  ContainerExprPBase<tcu::Vector<float,_3>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_3>_> *)&local_188,local_28);
  BuiltinPrecisionTests::operator*((BuiltinPrecisionTests *)&local_168,&local_178,&local_188);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_128,&local_138,&local_168);
  vec3((Functions *)this,&local_38,&local_b8,&local_128);
  ExprP<float>::~ExprP(&local_128);
  ExprP<float>::~ExprP(&local_168);
  ExprP<float>::~ExprP(&local_188);
  ExprP<float>::~ExprP(&local_178);
  ExprP<float>::~ExprP(&local_138);
  ExprP<float>::~ExprP(&local_158);
  ExprP<float>::~ExprP(&local_148);
  ExprP<float>::~ExprP(&local_b8);
  ExprP<float>::~ExprP(&local_f8);
  ExprP<float>::~ExprP(&local_118);
  ExprP<float>::~ExprP(&local_108);
  ExprP<float>::~ExprP(&local_c8);
  ExprP<float>::~ExprP(&local_e8);
  ExprP<float>::~ExprP(&local_d8);
  ExprP<float>::~ExprP(&local_38);
  ExprP<float>::~ExprP(local_88);
  ExprP<float>::~ExprP(&local_a8);
  ExprP<float>::~ExprP(&local_98);
  ExprP<float>::~ExprP(&local_48);
  ExprP<float>::~ExprP(&local_68);
  ExprP<float>::~ExprP(&local_58);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.super_ExprPBase<tcu::Vector<float,_3>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>.m_state =
       extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.super_ExprPBase<tcu::Vector<float,_3>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_3>_> *)this;
  return (ExprP<tcu::Vector<float,_3>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.
         super_ExprPBase<tcu::Vector<float,_3>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>;
}

Assistant:

ExprP<Vec3>		doExpand	(ExpandContext&, const ArgExprs& x) const
	{
		return vec3(x.a[1] * x.b[2] - x.b[1] * x.a[2],
					x.a[2] * x.b[0] - x.b[2] * x.a[0],
					x.a[0] * x.b[1] - x.b[0] * x.a[1]);
	}